

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O1

void __thiscall Storage::Disk::Drive::get_next_event(Drive *this,float duration_already_passed)

{
  element_type *peVar1;
  ulong uVar2;
  int iVar3;
  uint extraout_var;
  uint extraout_EDX;
  float interval;
  float fVar4;
  
  if ((this->disk_).super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    *(undefined8 *)&(this->super_TimedEventLoop).field_0x1c = 0x3f80000000000000;
    interval = (1.0 - duration_already_passed) * this->rotational_multiplier_;
  }
  else {
    peVar1 = (this->track_).super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 == (element_type *)0x0) {
      this->random_interval_ = 0.0;
      setup_track(this);
      return;
    }
    fVar4 = this->random_interval_;
    if (0.0 < fVar4) {
      *(undefined4 *)&(this->super_TimedEventLoop).field_0x1c = 1;
      uVar2 = this->random_source_;
      interval = (float)((uint)uVar2 & 1 | 2) / 1e+06;
      *(float *)&this->field_0x30 = interval;
      this->random_source_ = uVar2 >> 1 | (ulong)((uVar2 & 1) != 0) << 0x3f;
      if (interval <= fVar4 + -5e-06) {
        this->random_interval_ = fVar4 - interval;
        goto LAB_00442231;
      }
      this->random_interval_ = 0.0;
    }
    iVar3 = (*peVar1->_vptr_Track[2])();
    *(int *)&(this->super_TimedEventLoop).field_0x1c = iVar3;
    *(float *)&this->field_0x30 = (float)extraout_var / (float)extraout_EDX;
    fVar4 = ((float)extraout_var / (float)extraout_EDX - duration_already_passed) *
            this->rotational_multiplier_;
    interval = 0.0;
    if (0.0 <= fVar4) {
      interval = fVar4;
    }
    if (1.5e-05 <= interval) {
      this->random_interval_ = interval + -1.5e-05;
      interval = 1.5e-05;
    }
  }
LAB_00442231:
  TimedEventLoop::set_next_event_time_interval(&this->super_TimedEventLoop,interval);
  return;
}

Assistant:

void Drive::get_next_event(float duration_already_passed) {
	/*
		Quick word on random-bit generation logic below; it seeks to obey the following logic:
		if there is a gap of 15µs between recorded bits, start generating flux transitions
		at random intervals thereafter, unless and until one is within 5µs of the next real transition.

		This behaviour is based on John Morris' observations of an MC3470, as described in his WOZ
		file format documentation — https://applesaucefdc.com/woz/reference2/
	*/

	if(!disk_) {
		current_event_.type = Track::Event::IndexHole;
		current_event_.length = 1.0f;
		set_next_event_time_interval((current_event_.length - duration_already_passed) * rotational_multiplier_);
		return;
	}

	// Grab a new track if not already in possession of one. This will recursively call get_next_event,
	// supplying a proper duration_already_passed.
	if(!track_) {
		random_interval_ = 0.0f;
		setup_track();
		return;
	}

	// If gain has now been turned up so as to generate noise, generate some noise.
	if(random_interval_ > 0.0f) {
		current_event_.type = Track::Event::FluxTransition;
		current_event_.length = float(2 + (random_source_&1)) / 1'000'000.0f;
		random_source_ = (random_source_ >> 1) | (random_source_ << 63);

		// If this random transition is closer than 5µs to the next real bit,
		// discard it.
		if(random_interval_ - 5.0f / 1'000'000.f < current_event_.length) {
			random_interval_ = 0.0f;
		} else {
			random_interval_ -= current_event_.length;
			set_next_event_time_interval(current_event_.length);
			return;
		}
	}

	if(track_) {
		const auto track_event = track_->get_next_event();
		current_event_.type = track_event.type;
		current_event_.length = track_event.length.get<float>();
	} else {
		current_event_.length = 1.0f;
		current_event_.type = Track::Event::IndexHole;
	}

	// divide interval, which is in terms of a single rotation of the disk, by rotation speed to
	// convert it into revolutions per second; this is achieved by multiplying by rotational_multiplier_
	float interval = std::max((current_event_.length - duration_already_passed) * rotational_multiplier_, 0.0f);

	// An interval greater than 15µs => adjust gain up the point where noise starts happening.
	// Seed that up and leave a 15µs gap until it starts.
	constexpr float safe_gain_period = 15.0f / 1'000'000.0f;
	if(interval >= safe_gain_period) {
		random_interval_ = interval - safe_gain_period;
		interval = safe_gain_period;
	}

	set_next_event_time_interval(interval);
}